

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O0

void __thiscall mp::pre::LinkRangeList::Add(LinkRangeList *this,LinkRange br)

{
  LinkRange br_00;
  bool bVar1;
  reference this_00;
  LinkIndexRange in_RDX;
  BasicLink *in_RSI;
  deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *in_RDI;
  value_type *in_stack_ffffffffffffffc8;
  deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::empty
                    ((deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_> *)0x1a4592);
  if (!bVar1) {
    this_00 = std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::back
                        (in_stack_ffffffffffffffe0);
    br_00.ir_ = in_RDX;
    br_00.b_ = in_RSI;
    bVar1 = LinkRange::TryExtendBy(this_00,br_00);
    if (bVar1) {
      return;
    }
  }
  std::deque<mp::pre::LinkRange,_std::allocator<mp::pre::LinkRange>_>::push_back
            (in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Add(LinkRange br) {
    if (empty() || !back().TryExtendBy(br))
      push_back(br);
  }